

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

MemberSyntax * parseMember(string *text)

{
  SourceManager *sourceManager;
  MemberSyntax *pMVar1;
  long lVar2;
  Diagnostic *__location;
  string_view name;
  string_view source;
  StringRef macroName;
  StringRef capturedExpression;
  MemberSyntax *member;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays_1;
  Parser parser;
  Preprocessor preprocessor;
  MemberSyntax *local_7b8;
  AssertionHandler local_7b0;
  undefined8 local_768;
  undefined8 uStack_760;
  ITransientExpression local_750;
  MemberSyntax **local_740;
  undefined1 local_738 [32];
  Info *local_718;
  size_t sStack_710;
  Preprocessor local_3c0;
  
  if (DAT_00cb2828 != 0) {
    lVar2 = DAT_00cb2828 * 0x70;
    __location = slang::diagnostics;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
      __location = __location + 1;
      lVar2 = lVar2 + -0x70;
    } while (lVar2 != 0);
  }
  DAT_00cb2828 = 0;
  sourceManager = getSourceManager();
  local_738._0_8_ = (BumpAllocator *)0x3f;
  local_738._8_8_ = (Preprocessor *)0x1;
  local_738._24_8_ = (value_type_pointer)0x0;
  local_738._16_8_ =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_718 = (Info *)0x0;
  sStack_710 = 0;
  local_768 = 0;
  uStack_760 = 0;
  slang::parsing::Preprocessor::Preprocessor
            (&local_3c0,sourceManager,(BumpAllocator *)slang::alloc,
             (Diagnostics *)&slang::diagnostics,(Bag *)local_738,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)local_738);
  name._M_str = "source";
  name._M_len = 6;
  source._M_str = (text->_M_dataplus)._M_p;
  source._M_len = text->_M_string_length;
  slang::parsing::Preprocessor::pushSource(&local_3c0,source,name);
  local_7b0.m_assertionInfo.macroName.m_start = (char *)0x3f;
  local_7b0.m_assertionInfo.macroName.m_size = 1;
  local_7b0.m_assertionInfo.lineInfo.line = 0;
  local_7b0.m_assertionInfo.lineInfo.file = "";
  local_7b0.m_assertionInfo.capturedExpression.m_start = (char *)0x0;
  local_7b0.m_assertionInfo.capturedExpression.m_size = 0;
  slang::parsing::Parser::Parser((Parser *)local_738,&local_3c0,(Bag *)&local_7b0);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&local_7b0);
  pMVar1 = slang::parsing::Parser::parseSingleMember((Parser *)local_738,ModuleDeclaration);
  local_750._vptr_ITransientExpression = (_func_int **)0xa0c9e2;
  local_750.m_isBinaryExpression = true;
  local_750.m_result = false;
  local_750._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 6;
  capturedExpression.m_start = "member";
  local_7b8 = pMVar1;
  Catch::AssertionHandler::AssertionHandler
            (&local_7b0,macroName,(SourceLineInfo *)&local_750,capturedExpression,Normal);
  local_750._8_8_ = (ulong)CONCAT61(local_750._10_6_,pMVar1 != (MemberSyntax *)0x0) << 8;
  local_750._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c8bde8;
  local_740 = &local_7b8;
  Catch::AssertionHandler::handleExpr(&local_7b0,&local_750);
  Catch::AssertionHandler::complete(&local_7b0);
  if (local_7b0.m_completed == false) {
    (*(local_7b0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  pMVar1 = local_7b8;
  slang::parsing::Parser::~Parser((Parser *)local_738);
  slang::parsing::Preprocessor::~Preprocessor(&local_3c0);
  return pMVar1;
}

Assistant:

const MemberSyntax& parseMember(const std::string& text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Parser parser(preprocessor);
    MemberSyntax* member = parser.parseSingleMember(SyntaxKind::ModuleDeclaration);
    REQUIRE(member);
    return *member;
}